

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rbuFossilDeltaFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  undefined1 *__dest;
  ulong uVar7;
  int local_6c;
  char *local_68;
  uint local_60;
  uint local_5c;
  undefined1 *local_58;
  int local_4c;
  sqlite3_context *local_48;
  ulong local_40;
  void *local_38;
  
  local_4c = sqlite3_value_bytes(*argv);
  local_38 = sqlite3_value_blob(*argv);
  iVar2 = sqlite3_value_bytes(argv[1]);
  pcVar6 = (char *)sqlite3_value_blob(argv[1]);
  local_6c = iVar2;
  local_68 = pcVar6;
  uVar3 = rbuDeltaGetInt(&local_68,&local_6c);
  uVar7 = (ulong)uVar3;
  if (*local_68 != '\n') {
    uVar7 = 0xffffffff;
  }
  if (-1 < (int)uVar7) {
    local_58 = (undefined1 *)sqlite3_malloc((int)uVar7 + 1);
    if (local_58 == (undefined1 *)0x0) {
      sqlite3_result_error_nomem(context);
      return;
    }
    local_6c = iVar2;
    local_68 = pcVar6;
    local_5c = 0xffffffff;
    local_48 = context;
    local_40 = uVar7;
    local_60 = rbuDeltaGetInt(&local_68,&local_6c);
    if (*local_68 == '\n') {
      pcVar6 = local_68 + 1;
      iVar2 = local_6c + -1;
      uVar3 = 0;
      __dest = local_58;
      local_6c = iVar2;
      local_68 = pcVar6;
      do {
        if ((*pcVar6 == '\0') || (iVar2 < 1)) break;
        uVar4 = rbuDeltaGetInt(&local_68,&local_6c);
        pcVar6 = local_68;
        iVar2 = local_6c;
        cVar1 = *local_68;
        uVar7 = (ulong)uVar4;
        if (cVar1 == ':') {
          if ((local_60 < uVar3 + uVar4) || (local_6c <= (int)uVar4)) break;
          memcpy(__dest,local_68 + 1,uVar7);
          pcVar6 = pcVar6 + uVar7 + 1;
          iVar2 = iVar2 + ~uVar4;
          local_6c = iVar2;
          local_68 = pcVar6;
        }
        else {
          if (cVar1 != '@') {
            if (cVar1 == ';') {
              *__dest = 0;
              local_5c = 0xffffffff;
              if (uVar3 == local_60) {
                local_5c = uVar3;
              }
            }
            break;
          }
          local_68 = local_68 + 1;
          local_6c = local_6c + -1;
          uVar5 = rbuDeltaGetInt(&local_68,&local_6c);
          if ((0 < local_6c) && (*local_68 != ',')) break;
          pcVar6 = local_68 + 1;
          iVar2 = local_6c + -1;
          local_6c = iVar2;
          local_68 = pcVar6;
          if ((local_60 < uVar3 + uVar4) || (local_4c < (int)(uVar4 + uVar5))) break;
          memcpy(__dest,(void *)((ulong)uVar5 + (long)local_38),uVar7);
        }
        uVar3 = uVar3 + uVar4;
        __dest = __dest + uVar7;
      } while( true );
    }
    if (local_5c == (uint)local_40) {
      sqlite3_result_blob(local_48,local_58,(uint)local_40,sqlite3_free);
      return;
    }
    sqlite3_free(local_58);
    context = local_48;
  }
  sqlite3_result_error(context,"corrupt fossil delta",-1);
  return;
}

Assistant:

static void rbuFossilDeltaFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *aDelta;
  int nDelta;
  const char *aOrig;
  int nOrig;

  int nOut;
  int nOut2;
  char *aOut;

  assert( argc==2 );

  nOrig = sqlite3_value_bytes(argv[0]);
  aOrig = (const char*)sqlite3_value_blob(argv[0]);
  nDelta = sqlite3_value_bytes(argv[1]);
  aDelta = (const char*)sqlite3_value_blob(argv[1]);

  /* Figure out the size of the output */
  nOut = rbuDeltaOutputSize(aDelta, nDelta);
  if( nOut<0 ){
    sqlite3_result_error(context, "corrupt fossil delta", -1);
    return;
  }

  aOut = sqlite3_malloc(nOut+1);
  if( aOut==0 ){
    sqlite3_result_error_nomem(context);
  }else{
    nOut2 = rbuDeltaApply(aOrig, nOrig, aDelta, nDelta, aOut);
    if( nOut2!=nOut ){
      sqlite3_free(aOut);
      sqlite3_result_error(context, "corrupt fossil delta", -1);
    }else{
      sqlite3_result_blob(context, aOut, nOut, sqlite3_free);
    }
  }
}